

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O3

void __thiscall
SRCTools::FIRResampler::process
          (FIRResampler *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  bool bVar1;
  FloatSample *pFVar2;
  FloatSample *pFVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  uVar4 = *outLength;
  do {
    if (uVar4 == 0) {
      return;
    }
    dVar7 = this->phase;
    dVar8 = (double)(this->constants).numberOfPhases;
    if (dVar8 <= dVar7) {
      pFVar2 = *inSamples;
      uVar4 = *inLength;
      do {
        if (uVar4 == 0) {
          return;
        }
        uVar4 = this->ringBufferPosition - 1 & (this->constants).delayLineMask;
        this->ringBufferPosition = uVar4;
        lVar6 = 0;
        pFVar3 = pFVar2;
        bVar1 = true;
        do {
          bVar5 = bVar1;
          pFVar2 = pFVar3 + 1;
          *inSamples = pFVar2;
          (this->constants).ringBuffer[uVar4][lVar6] = *pFVar3;
          lVar6 = 1;
          pFVar3 = pFVar2;
          bVar1 = false;
        } while (bVar5);
        dVar7 = dVar7 - dVar8;
        this->phase = dVar7;
        uVar4 = *inLength - 1;
        *inLength = uVar4;
        dVar8 = (double)(this->constants).numberOfPhases;
      } while (dVar8 <= dVar7);
    }
    getOutSamplesStereo(this,outSamples);
    *outLength = *outLength - 1;
    uVar4 = *outLength;
  } while( true );
}

Assistant:

void FIRResampler::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	while (outLength > 0) {
		while (needNextInSample()) {
			if (inLength == 0) return;
			addInSamples(inSamples);
			--inLength;
		}
		getOutSamplesStereo(outSamples);
		--outLength;
	}
}